

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O2

uint32_t WrapPosition(uint64_t position)

{
  uint uVar1;
  
  uVar1 = (uint)position;
  if (2 < position >> 0x1e) {
    uVar1 = (uVar1 & 0x3fffffff) + ((int)(uVar1 * 2) >> 1 & 0xc0000000U) + 0x80000000;
  }
  return uVar1;
}

Assistant:

static uint32_t WrapPosition(uint64_t position) {
  uint32_t result = (uint32_t)position;
  uint64_t gb = position >> 30;
  if (gb > 2) {
    /* Wrap every 2GiB; The first 3GB are continuous. */
    result = (result & ((1u << 30) - 1)) | ((uint32_t)((gb - 1) & 1) + 1) << 30;
  }
  return result;
}